

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testGFMath(void)

{
  initializer_list<int> __l;
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  exception *e_31;
  exception *e_30;
  exception *e_29;
  exception *e_28;
  exception *e_27;
  exception *e_26;
  exception *e_25;
  exception *e_24;
  exception *e_23;
  exception *e_22;
  exception *e_21;
  exception *e_20;
  exception *e_19;
  exception *e_18;
  exception *e_17;
  exception *e_16;
  exception *e_15;
  exception *e_14;
  exception *e_13;
  exception *e_12;
  exception *e_11;
  exception *e_10;
  exception *e_9;
  exception *e_8;
  exception *e_7;
  exception *e_6;
  exception *e_5;
  exception *e_4;
  exception *e_3;
  exception *e_2;
  exception *e_1;
  Element CopyofD;
  exception *e;
  Element D;
  Element C;
  Element B;
  Element A;
  int b;
  int a;
  Element H;
  Element G;
  Element F;
  Element E;
  Field gf;
  size_t i;
  vector<int,_std::allocator<int>_> gfs;
  Element *in_stack_fffffffffffff278;
  undefined7 in_stack_fffffffffffff280;
  undefined1 in_stack_fffffffffffff287;
  Element *in_stack_fffffffffffff290;
  undefined4 in_stack_fffffffffffff298;
  int in_stack_fffffffffffff29c;
  Element *in_stack_fffffffffffff2a0;
  int rhs;
  undefined4 in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2ac;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff2b0;
  undefined4 in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  Field *in_stack_fffffffffffff2c0;
  Element *in_stack_fffffffffffff2c8;
  undefined1 in_stack_fffffffffffff2d7;
  undefined1 local_9f9 [41];
  Element local_9d0;
  undefined1 local_9b9 [41];
  Element local_990;
  Element local_978;
  Element local_960 [8];
  Element local_8d8;
  Element local_8c0 [3];
  Element local_890 [3];
  Element local_860;
  Element local_848 [3];
  Element local_810 [3];
  Element local_7d8 [3];
  allocator local_7a1;
  string local_7a0 [136];
  Element local_718 [3];
  Element local_6e0;
  allocator local_6c9;
  string local_6c8 [72];
  Element local_680 [2];
  Element local_658;
  allocator local_641;
  string local_640 [136];
  Element local_5b8 [7];
  Element local_540;
  allocator local_529;
  string local_528 [72];
  Element local_4e0 [3];
  Element local_4a8;
  allocator local_491;
  string local_490 [72];
  Element local_448 [3];
  Element local_410;
  allocator local_3f9;
  string local_3f8 [40];
  Element local_3d0;
  Element local_3b8;
  Element local_3a0;
  Element local_388;
  Element local_370;
  Element local_358;
  allocator local_341;
  string local_340 [40];
  Element local_318;
  Element local_300;
  allocator local_2e9;
  string local_2e8 [40];
  Element local_2c0;
  Element local_2a8;
  allocator local_291;
  string local_290 [40];
  Element local_268;
  Element local_250;
  allocator local_239;
  string local_238 [32];
  Element local_218;
  allocator local_201;
  string local_200 [32];
  Element local_1e0;
  Element local_1d0;
  Element local_1b8;
  Element local_1a8;
  Element local_198;
  Element local_188;
  Element local_178;
  undefined4 local_168;
  undefined4 local_164;
  Element local_160;
  Element local_150;
  Element local_140;
  Element local_130 [12];
  ulong local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_28;
  undefined8 local_20;
  vector<int,_std::allocator<int>_> local_18;
  
  printf("\tTesting Galois field arithmetic...\n");
  local_48 = 0xb00000009;
  uStack_40 = 0x100000000d;
  local_38 = 0x31;
  local_28 = &local_48;
  local_20 = 5;
  std::allocator<int>::allocator((allocator<int> *)0x109190);
  __l._M_array._4_4_ = in_stack_fffffffffffff2bc;
  __l._M_array._0_4_ = in_stack_fffffffffffff2b8;
  __l._M_len = (size_type)in_stack_fffffffffffff2c0;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff2b0,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8));
  std::allocator<int>::~allocator((allocator<int> *)0x1091c4);
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_18);
    if (sVar2 <= uVar1) break;
    std::vector<int,_std::allocator<int>_>::operator[](&local_18,local_68);
    Galois::Field::Field(in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bc);
    poVar3 = std::operator<<((ostream *)&std::cout,"Testing GF(");
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_18,local_68);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar4);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    local_164 = 2;
    local_168 = 3;
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    Galois::Element::Element
              (in_stack_fffffffffffff2a0,
               (Field *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               (int)((ulong)in_stack_fffffffffffff290 >> 0x20));
    std::operator<<((ostream *)&std::cout,"A: ");
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"B: ");
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"C: ");
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"D: ");
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = A + B\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_1b8);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = -A\n");
    Galois::Element::operator-(in_stack_fffffffffffff278);
    Galois::Element::operator=(local_130,&local_1d0);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = -E\n");
    Galois::Element::operator-(in_stack_fffffffffffff278);
    Galois::Element::operator=(&local_140,&local_1e0);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_140,&local_178);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"ERROR: F==A is false",&local_201);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::operator<<((ostream *)&std::cout,"\nOK: F==A is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: copy constructor: Galois::Element CopyofD(D)\n"
                   );
    Galois::Element::Element(&local_218,&local_1a8);
    std::operator<<((ostream *)&std::cout,"RESULT: CopyofD = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_218,&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"ERROR: CopyofD==D is false",&local_239);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::operator<<((ostream *)&std::cout,"\nOK: CopyofD==D is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = C - D\n");
    Galois::Element::operator-
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0);
    Galois::Element::operator=(&local_140,&local_250);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = D + F\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_268);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_198,local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"ERROR: C==E is false",&local_291);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    std::operator<<((ostream *)&std::cout,"\nOK: C==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * B\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_140,&local_2a8);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = F / A\n");
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(local_130,&local_2c0);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_188,local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"ERROR: B==E is false",&local_2e9);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::operator<<((ostream *)&std::cout,"\nOK: B==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A / B\n");
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(&local_140,&local_300);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = F * B\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_318);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_178,local_130);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,"ERROR: A==E is false",&local_341);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    std::operator<<((ostream *)&std::cout,"\nOK: A==E is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = a * B\n");
    Galois::operator*(in_stack_fffffffffffff29c,in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_358);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * b\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
    Galois::Element::operator=(&local_140,&local_370);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E + F\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,&local_388);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = B * a\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20));
    Galois::Element::operator=(local_130,&local_3a0);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = b * A\n");
    Galois::operator*(in_stack_fffffffffffff29c,in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_140,&local_3b8);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = F + E\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_160,&local_3d0);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_150,&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"ERROR: G==H is false",&local_3f9);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B + C * D\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,&local_410);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = D * C + B * A\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_160,local_448);
    std::operator<<((ostream *)&std::cout,"RESULT: H = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_150,&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_490,"ERROR: G==H is false",&local_491);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B * C * D\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,&local_4a8);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = G / A\n");
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(&local_160,local_4e0);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_188,&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_528,"ERROR: B==H is false",&local_529);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::operator<<((ostream *)&std::cout,"\nOK: B==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: G = A * B * C * D * A * B * D * C\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,&local_540);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: H = A * A * C * C * B * B * D * D\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_160,local_5b8);
    std::operator<<((ostream *)&std::cout,"RESULT: H = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(&local_150,&local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_640,"ERROR: G==H is false",&local_641);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_640);
    std::allocator<char>::~allocator((allocator<char> *)&local_641);
    std::operator<<((ostream *)&std::cout,"\nOK: G==H is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + B) * C\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_658);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = A * C + B * C\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_140,local_680);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(local_130,&local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6c8,"ERROR: E==F is false",&local_6c9);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_6c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
    std::operator<<((ostream *)&std::cout,"\nOK: E==F is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + C) * (B + D)\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_6e0);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = B * A + D * A + C * B + D * C\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_140,local_718);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    Galois::operator==(local_130,&local_140);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_7a0,"ERROR: E==F is false",&local_7a1);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string(local_7a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
    std::operator<<((ostream *)&std::cout,"\nOK: E==F is true\n");
    std::operator<<((ostream *)&std::cout,"\nACTION: E = (A + C) / (B + D)\n");
    std::operator<<((ostream *)&std::cout,"A + C = ");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"B + D = ");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    poVar3 = Galois::operator<<((ostream *)
                                CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                                in_stack_fffffffffffff278);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(local_130,local_7d8);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = (D + B) / (C + A)\n");
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(&local_140,local_810);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E * F\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,local_848);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = 2*A + C*D\n");
    Galois::operator*(in_stack_fffffffffffff29c,in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(local_130,&local_860);
    std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = B*B - 5*D\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::operator*(in_stack_fffffffffffff29c,in_stack_fffffffffffff290);
    Galois::Element::operator-
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
               in_stack_fffffffffffff2a0);
    rhs = (int)((ulong)in_stack_fffffffffffff2a0 >> 0x20);
    Galois::Element::operator=(&local_140,local_890);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E / F\n");
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(&local_150,local_8c0);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n");
    Galois::Element::operator-(in_stack_fffffffffffff278);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),rhs);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),rhs);
    Galois::Element::operator+
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(&local_140,&local_8d8);
    std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: G = E * F\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_150,local_960);
    std::operator<<((ostream *)&std::cout,"RESULT: G = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = A / A\n");
    Galois::Element::operator/(in_stack_fffffffffffff2c8,(Element *)in_stack_fffffffffffff2c0);
    Galois::Element::operator=(local_130,&local_978);
    in_stack_fffffffffffff2c8 = (Element *)std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    std::operator<<((ostream *)&std::cout,"\nACTION: E = sqrt(A)\n");
    Galois::Element::sqrt(&local_990,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Galois::Element::operator=(local_130,&local_990);
    poVar3 = std::operator<<((ostream *)&std::cout,"RESULT: E = ");
    in_stack_fffffffffffff2bc = (int)((ulong)poVar3 >> 0x20);
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    in_stack_fffffffffffff2ac = Galois::Element::value(local_130);
    in_stack_fffffffffffff29c =
         CONCAT13(-1 < in_stack_fffffffffffff2ac,(int3)in_stack_fffffffffffff29c);
    in_stack_fffffffffffff2a0 = (Element *)local_9b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_9b9 + 1),"ERROR: A has no root",
               (allocator *)in_stack_fffffffffffff2a0);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string((string *)(local_9b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_9b9);
    std::operator<<((ostream *)&std::cout,"\nACTION: F = E * E\n");
    Galois::Element::operator*
              ((Element *)CONCAT44(in_stack_fffffffffffff29c,in_stack_fffffffffffff298),
               in_stack_fffffffffffff290);
    Galois::Element::operator=(&local_140,&local_9d0);
    in_stack_fffffffffffff290 = (Element *)std::operator<<((ostream *)&std::cout,"RESULT: F = ");
    Galois::operator<<((ostream *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280),
                       in_stack_fffffffffffff278);
    in_stack_fffffffffffff287 = Galois::operator==(&local_178,&local_140);
    in_stack_fffffffffffff278 = (Element *)local_9f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_9f9 + 1),"ERROR: A==F is false",
               (allocator *)in_stack_fffffffffffff278);
    Assert((bool)in_stack_fffffffffffff2d7,(string *)in_stack_fffffffffffff2c8);
    std::__cxx11::string::~string((string *)(local_9f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_9f9);
    std::operator<<((ostream *)&std::cout,"\nOK: A==F is true\n");
    std::operator<<((ostream *)&std::cout,"\n---------------------------------------------------\n")
    ;
    Galois::Field::~Field((Field *)CONCAT17(in_stack_fffffffffffff287,in_stack_fffffffffffff280));
    local_68 = local_68 + 1;
  }
  printf("passed\n");
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff290);
  return;
}

Assistant:

void testGFMath()
{
    printf("\tTesting Galois field arithmetic...\n");
    vector<int> gfs = {9, 11, 13, 16, 49};

    for (size_t i = 0; i < gfs.size(); ++i)
    {
        // Define Galois Galois::Field
        Galois::Field gf(gfs[i]);
        cout << "Testing GF(" << gfs[i] << ")" << endl;
        //---------------------------------

        Galois::Element E(&gf), F(&gf), G(&gf), H(&gf);

        int a = 2, b = 3;
        // cout << "a=" << a << "  b=" << b << endl;

        Galois::Element A(&gf, 1);
        Galois::Element B(&gf, 2);
        Galois::Element C(&gf, 3);
        Galois::Element D(&gf, 6);

        cout << "A: " << A << endl;
        cout << "B: " << B << endl;
        cout << "C: " << C << endl;
        cout << "D: " << D << endl;

        //*********************** action begins ************************

        try
        {
            cout << "\nACTION: E = A + B\n";
            E = A + B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        cout << "\nACTION: E = -A\n";
        E = -A;
        cout << "RESULT: E = " << E;

        cout << "\nACTION: F = -E\n";
        F = -E;
        cout << "RESULT: F = " << F;

        Assert(F == A, "ERROR: F==A is false");
        cout << "\nOK: F==A is true\n";

        //-------------------------------------------------------------
        cout << "\nACTION: copy constructor: Galois::Element CopyofD(D)\n";
        Galois::Element CopyofD(D);
        cout << "RESULT: CopyofD = " << CopyofD;

        Assert(CopyofD == D, "ERROR: CopyofD==D is false");
        cout << "\nOK: CopyofD==D is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = C - D\n";
            F = C - D;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = D + F\n";
            E = D + F;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(C == E, "ERROR: C==E is false");
        cout << "\nOK: C==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A * B\n";
            F = A * B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F / A\n";
            E = F / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == E, "ERROR: B==E is false");
        cout << "\nOK: B==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: F = A / B\n";
            F = A / B;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = F * B\n";
            E = F * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == E, "ERROR: A==E is false");
        cout << "\nOK: A==E is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = a * B\n";
            E = a * B;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * b\n";
            F = A * b;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E + F\n";
            G = E + F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: E = B * a\n";
            E = B * a;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = b * A\n";
            F = b * A;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = F + E\n";
            H = F + E;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B + C * D\n";
            G = A * B + C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = D * C + B * A\n";
            H = D * C + B * A;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D\n";
            G = A * B * C * D;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = G / A\n";
            H = (((G / A) / D) / C);
            cout << "RESULT: G = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(B == H, "ERROR: B==H is false");
        cout << "\nOK: B==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: G = A * B * C * D * A * B * D * C\n";
            G = A * B * C * D * A * B * D * C;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: H = A * A * C * C * B * B * D * D\n";
            H = A * A * C * C * B * B * D * D;
            cout << "RESULT: H = " << H;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(G == H, "ERROR: G==H is false");
        cout << "\nOK: G==H is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + B) * C\n";
            E = (A + B) * C;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = A * C + B * C\n";
            F = A * C + B * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) * (B + D)\n";
            E = (A + C) * (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = B * A + D * A + C * B + D * C\n";
            F = B * A + D * A + C * B + D * C;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E == F, "ERROR: E==F is false");
        cout << "\nOK: E==F is true\n";

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = (A + C) / (B + D)\n";
            cout << "A + C = " << (A + C) << endl;
            cout << "B + D = " << (B + D) << endl;
            E = (A + C) / (B + D);
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = (D + B) / (C + A)\n";
            F = (D + B) / (C + A);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = 2*A + C*D\n";
            E = 2 * A + C * D;
            cout << "RESULT: E = " << E;
            cout << "\nACTION: F = B*B - 5*D\n";
            F = B * B - 5 * D;
            cout << "RESULT: F = " << F;
            cout << "\nACTION: G = E / F\n";
            G = E / F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: F = ((-D)*5 + B*B) / (D*C + A*2)\n";
            F = ((-D) * 5 + B * B) / (D * C + A * 2);
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        try
        {
            cout << "\nACTION: G = E * F\n";
            G = E * F;
            cout << "RESULT: G = " << G;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = A / A\n";
            E = A / A;
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        //-------------------------------------------------------------
        try
        {
            cout << "\nACTION: E = sqrt(A)\n";
            E = A.sqrt();
            cout << "RESULT: E = " << E;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(E.value() >= 0, "ERROR: A has no root");

        try
        {
            cout << "\nACTION: F = E * E\n";
            F = E * E;
            cout << "RESULT: F = " << F;
        }
        catch (const exception &e)
        {
            cout << e.what() << endl;
        }

        Assert(A == F, "ERROR: A==F is false");
        cout << "\nOK: A==F is true\n";

        cout << "\n---------------------------------------------------\n";
    }
    printf("passed\n");
}